

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

TCGv_i32 gen_ea_mode(CPUM68KState_conflict *env,DisasContext_conflict2 *s,int mode,int reg0,
                    int opsize,TCGv_i32 val,TCGv_i32 *addrp,ea_what what,int index)

{
  int iVar1;
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 addr;
  uint32_t uVar2;
  TCGv_i32 pTVar3;
  TCGTemp *pTVar4;
  TCGv_i32 pTVar5;
  _Bool give_temp;
  int32_t arg2;
  TCGv_i32 *ppTVar6;
  
  tcg_ctx = s->uc->tcg_ctx;
  switch(mode) {
  case 0:
    pTVar3 = tcg_ctx->cpu_dregs[(uint)reg0];
    if (what != EA_STORE) {
LAB_007013b1:
      pTVar3 = gen_extend(s,pTVar3,opsize,(uint)(what == EA_LOADS));
      return pTVar3;
    }
    gen_partset_reg(tcg_ctx,opsize,pTVar3,val);
    break;
  case 1:
    ppTVar6 = s->writeback;
    if (((uint)s->writeback_mask >> (reg0 & 0x1fU) & 1) == 0) {
      ppTVar6 = tcg_ctx->cpu_aregs;
    }
    pTVar3 = ppTVar6[(uint)reg0];
    if (what != EA_STORE) goto LAB_007013b1;
    if (pTVar3 != val) {
      tcg_gen_op2_m68k(tcg_ctx,INDEX_op_mov_i32,(TCGArg)(pTVar3 + (long)tcg_ctx),
                       (TCGArg)(val + (long)tcg_ctx));
    }
    break;
  case 2:
    ppTVar6 = tcg_ctx->cpu_aregs;
    if (((uint)s->writeback_mask >> (reg0 & 0x1fU) & 1) != 0) {
      ppTVar6 = s->writeback;
    }
    pTVar3 = ppTVar6[(uint)reg0];
    goto LAB_007012bb;
  case 3:
    ppTVar6 = s->writeback;
    if (((uint)s->writeback_mask >> (reg0 & 0x1fU) & 1) == 0) {
      ppTVar6 = tcg_ctx->cpu_aregs;
    }
    addr = ppTVar6[(uint)reg0];
    pTVar5 = gen_ldst(s,opsize,addr,val,what,index);
    if (addrp != (TCGv_i32 *)0x0 && what != EA_STORE) {
      return pTVar5;
    }
    pTVar4 = tcg_temp_new_internal_m68k(tcg_ctx,TCG_TYPE_I32,false);
    pTVar3 = (TCGv_i32)((long)pTVar4 - (long)tcg_ctx);
    if ((reg0 != 7 || opsize != 0) || (arg2 = 2, (s->env->features & 1) == 0)) {
      arg2 = *(int32_t *)(&DAT_00d88548 + (long)opsize * 4);
    }
    tcg_gen_addi_i32_m68k(tcg_ctx,pTVar3,addr,arg2);
    give_temp = true;
    goto LAB_00701450;
  case 4:
    if (what == EA_STORE && addrp != (TCGv_i32 *)0x0) {
      pTVar3 = *addrp;
    }
    else {
      pTVar3 = gen_lea_mode(env,s,4,reg0,opsize);
      if (pTVar3 == tcg_ctx->NULL_QREG) {
        return pTVar3;
      }
      if (addrp != (TCGv_i32 *)0x0) {
        *addrp = pTVar3;
      }
    }
    pTVar5 = gen_ldst(s,opsize,pTVar3,val,what,index);
    if (addrp != (TCGv_i32 *)0x0 && what != EA_STORE) {
      return pTVar5;
    }
    give_temp = false;
LAB_00701450:
    delay_set_areg(s,reg0,pTVar3,give_temp);
    return pTVar5;
  case 7:
    if (3 < (uint)reg0) {
      if (reg0 == 4) {
        if (opsize == 2) {
          uVar2 = read_im32(env,s);
        }
        else if (opsize == 1) {
          uVar2 = cpu_lduw_code_m68k(env,s->pc);
          s->pc = s->pc + 2;
          if (what == EA_LOADS) {
            uVar2 = (uint32_t)(short)uVar2;
          }
          else {
            uVar2 = uVar2 & 0xffff;
          }
        }
        else {
          uVar2 = cpu_lduw_code_m68k(env,s->pc);
          s->pc = s->pc + 2;
          if (what == EA_LOADS) {
            uVar2 = (uint32_t)(char)uVar2;
          }
          else {
            uVar2 = uVar2 & 0xff;
          }
        }
        pTVar3 = tcg_const_i32_m68k(tcg_ctx,uVar2);
        iVar1 = s->release_count;
        if ((long)iVar1 < 8) {
          s->release_count = iVar1 + 1;
          s->release[iVar1] = pTVar3;
          return pTVar3;
        }
        g_assertion_message_expr
                  ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/m68k/translate.c"
                   ,0x91,"s->release_count < MAX_TO_RELEASE");
      }
      goto switchD_007011e9_default;
    }
  case 5:
  case 6:
    if (what == EA_STORE && addrp != (TCGv_i32 *)0x0) {
      pTVar3 = *addrp;
    }
    else {
      pTVar3 = gen_lea_mode(env,s,mode,reg0,opsize);
      if (pTVar3 == tcg_ctx->NULL_QREG) {
        return pTVar3;
      }
      if (addrp != (TCGv_i32 *)0x0) {
        *addrp = pTVar3;
      }
    }
LAB_007012bb:
    pTVar3 = gen_ldst(s,opsize,pTVar3,val,what,index);
    return pTVar3;
  default:
switchD_007011e9_default:
    return tcg_ctx->NULL_QREG;
  }
  return tcg_ctx->store_dummy;
}

Assistant:

static TCGv gen_ea_mode(CPUM68KState *env, DisasContext *s, int mode, int reg0,
                        int opsize, TCGv val, TCGv *addrp, ea_what what,
                        int index)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg, tmp, result;
    int32_t offset;

    switch (mode) {
    case 0: /* Data register direct.  */
        reg = tcg_ctx->cpu_dregs[reg0];
        if (what == EA_STORE) {
            gen_partset_reg(tcg_ctx, opsize, reg, val);
            return tcg_ctx->store_dummy;
        } else {
            return gen_extend(s, reg, opsize, what == EA_LOADS);
        }
    case 1: /* Address register direct.  */
        reg = get_areg(s, reg0);
        if (what == EA_STORE) {
            tcg_gen_mov_i32(tcg_ctx, reg, val);
            return tcg_ctx->store_dummy;
        } else {
            return gen_extend(s, reg, opsize, what == EA_LOADS);
        }
    case 2: /* Indirect register */
        reg = get_areg(s, reg0);
        return gen_ldst(s, opsize, reg, val, what, index);
    case 3: /* Indirect postincrement.  */
        reg = get_areg(s, reg0);
        result = gen_ldst(s, opsize, reg, val, what, index);
        if (what == EA_STORE || !addrp) {
            TCGv tmp = tcg_temp_new(tcg_ctx);
            if (reg0 == 7 && opsize == OS_BYTE &&
                m68k_feature(s->env, M68K_FEATURE_M68000)) {
                tcg_gen_addi_i32(tcg_ctx, tmp, reg, 2);
            } else {
                tcg_gen_addi_i32(tcg_ctx, tmp, reg, opsize_bytes(opsize));
            }
            delay_set_areg(s, reg0, tmp, true);
        }
        return result;
    case 4: /* Indirect predecrememnt.  */
        if (addrp && what == EA_STORE) {
            tmp = *addrp;
        } else {
            tmp = gen_lea_mode(env, s, mode, reg0, opsize);
            if (IS_NULL_QREG(tmp)) {
                return tmp;
            }
            if (addrp) {
                *addrp = tmp;
            }
        }
        result = gen_ldst(s, opsize, tmp, val, what, index);
        if (what == EA_STORE || !addrp) {
            delay_set_areg(s, reg0, tmp, false);
        }
        return result;
    case 5: /* Indirect displacement.  */
    case 6: /* Indirect index + displacement.  */
    do_indirect:
        if (addrp && what == EA_STORE) {
            tmp = *addrp;
        } else {
            tmp = gen_lea_mode(env, s, mode, reg0, opsize);
            if (IS_NULL_QREG(tmp)) {
                return tmp;
            }
            if (addrp) {
                *addrp = tmp;
            }
        }
        return gen_ldst(s, opsize, tmp, val, what, index);
    case 7: /* Other */
        switch (reg0) {
        case 0: /* Absolute short.  */
        case 1: /* Absolute long.  */
        case 2: /* pc displacement  */
        case 3: /* pc index+displacement.  */
            goto do_indirect;
        case 4: /* Immediate.  */
            /* Sign extend values for consistency.  */
            switch (opsize) {
            case OS_BYTE:
                if (what == EA_LOADS) {
                    offset = (int8_t)read_im8(env, s);
                } else {
                    offset = read_im8(env, s);
                }
                break;
            case OS_WORD:
                if (what == EA_LOADS) {
                    offset = (int16_t)read_im16(env, s);
                } else {
                    offset = read_im16(env, s);
                }
                break;
            case OS_LONG:
                offset = read_im32(env, s);
                break;
            default:
                g_assert_not_reached();
            }
            return mark_to_release(s, tcg_const_i32(tcg_ctx, offset));
        default:
            return tcg_ctx->NULL_QREG;
        }
    }
    /* Should never happen.  */
    return tcg_ctx->NULL_QREG;
}